

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O3

ChFrameMoving<double> * __thiscall
chrono::ChFrameMoving<double>::operator=(ChFrameMoving<double> *this,ChFrame<double> *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if ((ChFrameMoving<double> *)other != this) {
    ChFrame<double>::operator=(&this->super_ChFrame<double>,other);
    dVar1 = QNULL;
    dVar4 = DAT_00b68848;
    dVar2 = DAT_00b68838;
    dVar3 = DAT_00b68840;
    if (this != (ChFrameMoving<double> *)0xb68758) {
      (this->coord_dtdt).rot.m_data[0] = QNULL;
      dVar3 = DAT_00b68840;
      dVar2 = DAT_00b68838;
      (this->coord_dtdt).rot.m_data[1] = DAT_00b68838;
      (this->coord_dtdt).rot.m_data[2] = dVar3;
      dVar4 = DAT_00b68848;
      (this->coord_dtdt).rot.m_data[3] = DAT_00b68848;
    }
    (this->coord_dt).rot.m_data[0] = dVar1;
    (this->coord_dt).rot.m_data[1] = dVar2;
    (this->coord_dt).rot.m_data[2] = dVar3;
    (this->coord_dt).rot.m_data[3] = dVar4;
  }
  return this;
}

Assistant:

ChFrameMoving<Real>& operator=(const ChFrame<Real>& other) {
        if (&other == this)
            return *this;
        ChFrame<Real>::operator=(other);
        coord_dt.rot = coord_dtdt.rot = QNULL;
        return *this;
    }